

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

size_t utf8spn(void *src,void *accept)

{
  size_t in_RAX;
  size_t sVar1;
  size_t chars;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  
  sVar2 = 0;
  do {
    sVar1 = sVar2;
    if (*src == '\0') {
      return sVar1;
    }
    cVar5 = *accept;
    bVar6 = cVar5 == '\0';
    sVar2 = sVar1;
    if (!bVar6) {
      lVar4 = 0;
      pcVar3 = (char *)accept;
      do {
        if (cVar5 == *(char *)((long)src + lVar4)) {
          lVar4 = lVar4 + 1;
        }
        else {
          lVar4 = 0;
        }
        pcVar3 = pcVar3 + 1;
        cVar5 = *pcVar3;
        bVar6 = cVar5 == '\0';
        if (bVar6) goto LAB_0011182d;
      } while (lVar4 == 0);
      sVar2 = sVar1 + 1;
      src = (void *)((long)src + lVar4);
      sVar1 = in_RAX;
    }
LAB_0011182d:
    in_RAX = sVar1;
    if (bVar6) {
      return sVar1;
    }
  } while( true );
}

Assistant:

size_t utf8spn(const void *src, const void *accept) {
  const char *s = (const char *)src;
  size_t chars = 0;

  while ('\0' != *s) {
    const char *a = (const char *)accept;
    size_t offset = 0;

    while ('\0' != *a) {
      // checking that if *r is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *a)) && (0 < offset)) {
        // found a match, so increment the number of utf8 codepoints
        // that have matched and stop checking whether any other utf8
        // codepoints in a match
        chars++;
        s += offset;
        break;
      } else {
        if (*a == s[offset]) {
          offset++;
          a++;
        } else {
          // a could be in the middle of an unmatching utf8 codepoint,
          // so we need to march it on to the next character beginning,
          do {
            a++;
          } while (0x80 == (0xc0 & *a));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // if a got to its terminating null byte, then we didn't find a match.
    // Return the current number of matched utf8 codepoints
    if ('\0' == *a) {
      return chars;
    }
  }

  return chars;
}